

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::ReporterRegistrar<Catch::ConsoleReporter>::ReporterRegistrar
          (ReporterRegistrar<Catch::ConsoleReporter> *this,string *name)

{
  IMutableRegistryHub *pIVar1;
  long *plVar2;
  
  pIVar1 = getMutableRegistryHub();
  plVar2 = (long *)operator_new(0x10);
  *plVar2 = 0;
  plVar2[1] = 0;
  *(undefined4 *)(plVar2 + 1) = 0;
  *plVar2 = (long)&PTR__IReporter_0016fcc8;
  *(undefined4 *)(plVar2 + 1) = 1;
  (*pIVar1->_vptr_IMutableRegistryHub[2])(pIVar1,name);
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 0x18))();
  }
  return;
}

Assistant:

ReporterRegistrar( std::string const& name ) {
            getMutableRegistryHub().registerReporter( name, new ReporterFactory() );
        }